

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O1

bool cmFileSetVisibilityIsForInterface(cmFileSetVisibility vis)

{
  return (bool)(6U >> ((byte)vis & 7) & vis < (Interface|Public));
}

Assistant:

bool cmFileSetVisibilityIsForInterface(cmFileSetVisibility vis)
{
  switch (vis) {
    case cmFileSetVisibility::Interface:
    case cmFileSetVisibility::Public:
      return true;
    case cmFileSetVisibility::Private:
      return false;
  }
  return false;
}